

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
          (ShaderImageLoadStoreBase *this,char *src_vs,char *src_tcs,char *src_tes,char *src_gs,
          char *src_fs,bool *result)

{
  bool bVar1;
  GLuint program;
  GLuint GVar2;
  GLuint sh_4;
  GLuint sh_3;
  GLuint sh_2;
  GLuint sh_1;
  GLuint sh;
  GLuint p;
  char *src_fs_local;
  char *src_gs_local;
  char *src_tes_local;
  char *src_tcs_local;
  char *src_vs_local;
  ShaderImageLoadStoreBase *this_local;
  
  _sh = src_fs;
  src_fs_local = src_gs;
  src_gs_local = src_tes;
  src_tes_local = src_tcs;
  src_tcs_local = src_vs;
  src_vs_local = (char *)this;
  program = glu::CallLogWrapper::glCreateProgram
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper);
  if (src_tcs_local != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8b31);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar2);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2,1,
               &src_tcs_local,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",src_tcs_local);
      if (result == (bool *)0x0) {
        return program;
      }
      *result = false;
      return program;
    }
  }
  if (src_tes_local != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8e88);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar2);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2,1,
               &src_tes_local,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",src_tes_local);
      if (result == (bool *)0x0) {
        return program;
      }
      *result = false;
      return program;
    }
  }
  if (src_gs_local != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8e87);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar2);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2,1,&src_gs_local
               ,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",src_gs_local);
      if (result == (bool *)0x0) {
        return program;
      }
      *result = false;
      return program;
    }
  }
  if (src_fs_local != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8dd9);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar2);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2,1,&src_fs_local
               ,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",src_fs_local);
      if (result == (bool *)0x0) {
        return program;
      }
      *result = false;
      return program;
    }
  }
  if (_sh != (char *)0x0) {
    GVar2 = glu::CallLogWrapper::glCreateShader
                      (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8b30);
    glu::CallLogWrapper::glAttachShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,GVar2);
    glu::CallLogWrapper::glDeleteShader
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2);
    glu::CallLogWrapper::glShaderSource
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GVar2,1,
               (GLchar **)&sh,(GLint *)0x0);
    bVar1 = CompileShader(this,GVar2);
    if (!bVar1) {
      anon_unknown_0::Output("%s\n",_sh);
      if (result == (bool *)0x0) {
        return program;
      }
      *result = false;
      return program;
    }
  }
  bVar1 = LinkProgram(this,program);
  if (!bVar1) {
    if (src_tcs_local != (char *)0x0) {
      anon_unknown_0::Output("%s\n",src_tcs_local);
    }
    if (src_tes_local != (char *)0x0) {
      anon_unknown_0::Output("%s\n",src_tes_local);
    }
    if (src_gs_local != (char *)0x0) {
      anon_unknown_0::Output("%s\n",src_gs_local);
    }
    if (src_fs_local != (char *)0x0) {
      anon_unknown_0::Output("%s\n",src_fs_local);
    }
    if (_sh != (char *)0x0) {
      anon_unknown_0::Output("%s\n",_sh);
    }
    if (result != (bool *)0x0) {
      *result = false;
    }
  }
  return program;
}

Assistant:

GLuint BuildProgram(const char* src_vs, const char* src_tcs, const char* src_tes, const char* src_gs,
						const char* src_fs, bool* result = NULL)
	{
		const GLuint p = glCreateProgram();

		if (src_vs)
		{
			GLuint sh = glCreateShader(GL_VERTEX_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_vs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_vs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_tcs)
		{
			GLuint sh = glCreateShader(GL_TESS_CONTROL_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tcs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_tcs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_tes)
		{
			GLuint sh = glCreateShader(GL_TESS_EVALUATION_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_tes, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_tes);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_gs)
		{
			GLuint sh = glCreateShader(GL_GEOMETRY_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_gs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_gs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (src_fs)
		{
			GLuint sh = glCreateShader(GL_FRAGMENT_SHADER);
			glAttachShader(p, sh);
			glDeleteShader(sh);
			glShaderSource(sh, 1, &src_fs, NULL);
			if (!CompileShader(sh))
			{
				Output("%s\n", src_fs);
				if (result)
					*result = false;
				return p;
			}
		}
		if (!LinkProgram(p))
		{
			if (src_vs)
				Output("%s\n", src_vs);
			if (src_tcs)
				Output("%s\n", src_tcs);
			if (src_tes)
				Output("%s\n", src_tes);
			if (src_gs)
				Output("%s\n", src_gs);
			if (src_fs)
				Output("%s\n", src_fs);
			if (result)
				*result = false;
			return p;
		}

		return p;
	}